

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

NodeRef<typename_WshSatisfier::Key> __thiscall
miniscript::FromScript<WshSatisfier>(miniscript *this,CScript *script,WshSatisfier *ctx)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long in_FS_OFFSET;
  NodeRef<typename_WshSatisfier::Key> NVar5;
  NodeRef<CPubKey> ret;
  iterator it;
  optional<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  decomposed;
  long local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __normal_iterator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  local_58;
  _Storage<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_false>
  local_50;
  char local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (script->super_CScriptBase)._size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  uVar3 = internal::MaxScriptSize((ctx->super_Satisfier<CPubKey>).m_script_ctx);
  if (uVar3 < uVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_00339de3:
      __stack_chk_fail();
    }
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    _Var4._M_pi = extraout_RDX;
  }
  else {
    internal::DecomposeScript
              ((optional<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                *)&local_50._M_value,script);
    if (local_38 == '\0') {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
    }
    else {
      local_58._M_current =
           local_50._M_value.
           super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      internal::
      DecodeScript<CPubKey,WshSatisfier,__gnu_cxx::__normal_iterator<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>*,std::vector<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
                ((internal *)&local_68,&local_58,
                 (__normal_iterator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                  )local_50._M_value.
                   super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,ctx);
      _Var4._M_pi = local_60._M_pi;
      if ((local_68 == 0) ||
         (local_58._M_current !=
          local_50._M_value.
          super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
      }
      else {
        *(long *)this = local_68;
        local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var4._M_pi;
        local_68 = 0;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    }
    std::
    _Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::_M_reset((_Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                *)&local_50._M_value);
    _Var4._M_pi = extraout_RDX_00;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_00339de3;
  }
  NVar5.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  NVar5.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (NodeRef<typename_WshSatisfier::Key>)
         NVar5.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline NodeRef<typename Ctx::Key> FromScript(const CScript& script, const Ctx& ctx) {
    using namespace internal;
    // A too large Script is necessarily invalid, don't bother parsing it.
    if (script.size() > MaxScriptSize(ctx.MsContext())) return {};
    auto decomposed = DecomposeScript(script);
    if (!decomposed) return {};
    auto it = decomposed->begin();
    auto ret = DecodeScript<typename Ctx::Key>(it, decomposed->end(), ctx);
    if (!ret) return {};
    if (it != decomposed->end()) return {};
    return ret;
}